

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

void __thiscall blc::network::Client::Client(Client *this,int socket,sockaddr_in addr)

{
  uint16_t uVar1;
  char *pcVar2;
  undefined8 in_RDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  sockaddr_in data;
  uint16_t uStackY_36;
  in_addr iStackY_34;
  Socket *in_stack_ffffffffffffffd0;
  
  Socket::Socket(in_stack_ffffffffffffffd0);
  *in_RDI = &PTR_write_001308f8;
  *(undefined4 *)(in_RDI + 1) = in_ESI;
  iStackY_34.s_addr = (in_addr_t)((ulong)in_RDX >> 0x20);
  pcVar2 = inet_ntoa(iStackY_34);
  std::__cxx11::string::operator=((string *)(in_RDI + 2),pcVar2);
  uStackY_36 = (uint16_t)((ulong)in_RDX >> 0x10);
  uVar1 = ntohs(uStackY_36);
  *(uint *)(in_RDI + 6) = (uint)uVar1;
  *(undefined1 *)(in_RDI + 8) = 1;
  return;
}

Assistant:

blc::network::Client::Client(int socket, struct sockaddr_in addr) : Socket() {
	struct sockaddr_in data;

	data = *((struct sockaddr_in*)(&addr));
	this->_socket = socket;
	this->_address = inet_ntoa(data.sin_addr);
	this->_port = ntohs(data.sin_port);
	this->_opened = true;
}